

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::CopyAnyArrayElementsToVar<unsigned_int>
               (JavascriptArray *dstArray,uint dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end)

{
  bool bVar1;
  JavascriptCopyOnAccessNativeIntArray *pJVar2;
  JavascriptNativeIntArray *srcArray_00;
  JavascriptNativeFloatArray *srcArray_01;
  
  if (srcArray != (JavascriptArray *)0x0) {
    bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(srcArray);
    if (bVar1) {
      pJVar2 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(srcArray);
    }
    else {
      pJVar2 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (pJVar2 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar2);
    }
  }
  if (dstArray != (JavascriptArray *)0x0) {
    bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(dstArray);
    if (bVar1) {
      pJVar2 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(dstArray);
    }
    else {
      pJVar2 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (pJVar2 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar2);
    }
  }
  bVar1 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(srcArray);
  if (bVar1) {
    srcArray_00 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(srcArray);
  }
  else {
    srcArray_00 = (JavascriptNativeIntArray *)0x0;
  }
  if (srcArray_00 != (JavascriptNativeIntArray *)0x0) {
    CopyNativeIntArrayElementsToVar(dstArray,dstIndex,srcArray_00,start,end);
    return;
  }
  bVar1 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(srcArray);
  if (bVar1) {
    srcArray_01 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(srcArray);
  }
  else {
    srcArray_01 = (JavascriptNativeFloatArray *)0x0;
  }
  if (srcArray_01 != (JavascriptNativeFloatArray *)0x0) {
    CopyNativeFloatArrayElementsToVar(dstArray,dstIndex,srcArray_01,start,end);
    return;
  }
  CopyArrayElements(dstArray,dstIndex,srcArray,start,end);
  return;
}

Assistant:

void JavascriptArray::CopyAnyArrayElementsToVar(JavascriptArray* dstArray, T dstIndex, JavascriptArray* srcArray, uint32 start, uint32 end)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(srcArray);
#endif
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(dstArray);
#endif
        JavascriptNativeIntArray * nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(srcArray);
        if (nativeIntArray)
        {
            CopyNativeIntArrayElementsToVar(dstArray, dstIndex, nativeIntArray, start, end);
        }
        else
        {
            JavascriptNativeFloatArray * nativeFloatArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(srcArray);
            if (nativeFloatArray)
            {
                CopyNativeFloatArrayElementsToVar(dstArray, dstIndex, nativeFloatArray, start, end);
            }
            else
            {
                CopyArrayElements(dstArray, dstIndex, srcArray, start, end);
            }
        }
    }